

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase383::run(TestCase383 *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  AsyncIoProvider *pAVar4;
  undefined4 extraout_var;
  NetworkAddress *pNVar5;
  RefOrVoid<kj::ConnectionReceiver> pCVar6;
  undefined4 extraout_var_00;
  ConnectionReceiver *pCVar7;
  RefOrVoid<kj::AsyncIoStream> connection_00;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  void *extraout_RDX_01;
  char *pcVar8;
  Reader RVar9;
  int local_738;
  bool local_731;
  int local_730;
  DebugExpression<int> DStack_72c;
  bool _kj_shouldLog_2;
  undefined1 local_728 [8];
  DebugComparison<int,_int_&> _kjCondition_2;
  bool local_6e9;
  undefined1 auStack_6e8 [7];
  bool _kj_shouldLog_1;
  size_t local_6e0;
  char (*local_6d8) [4];
  undefined1 local_6d0 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_1;
  SourceLocation local_698;
  undefined1 local_680 [48];
  undefined1 local_650 [8];
  Response<capnproto_test::capnp::test::TestInterface::FooResults> response;
  int local_608;
  DebugExpression<int> DStack_604;
  bool _kj_shouldLog;
  undefined1 local_600 [8];
  DebugComparison<int,_int_&> _kjCondition;
  Maybe<capnp::MessageSize> local_5d0;
  undefined1 local_5b8 [8];
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  request;
  undefined1 local_570 [8];
  Client cap;
  TwoPartyClient client;
  undefined1 local_1d8 [24];
  Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> local_1c0;
  undefined1 local_1b8 [8];
  Own<kj::AsyncIoStream,_std::nullptr_t> connection;
  SourceLocation local_1a0;
  StringPtr local_188;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_178;
  Own<kj::NetworkAddress,_std::nullptr_t> local_170;
  undefined1 local_160 [8];
  Promise<void> listenPromise;
  Own<kj::ConnectionReceiver,_std::nullptr_t> listener;
  Maybe<kj::Own<kj::TaskSet::Task,_kj::_::PromiseDisposer>_> local_128;
  Disposer *local_120;
  Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> local_118;
  undefined1 local_110 [8];
  Own<kj::NetworkAddress,_std::nullptr_t> address;
  Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_> local_f8;
  undefined1 local_d0 [40];
  TwoPartyServer server;
  undefined1 local_40 [4];
  int callCount;
  AsyncIoContext ioContext;
  TestCase383 *this_local;
  
  ioContext.unixEventPort = (UnixEventPort *)this;
  kj::setupAsyncIo();
  server.tasks.location.columnNumber = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>
            ((kj *)local_d0,(int *)&server.tasks.location.columnNumber);
  Capability::Client::Client<capnp::_::TestInterfaceImpl,void>
            ((Client *)(local_d0 + 0x10),
             (Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)local_d0);
  kj::Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_>::Maybe(&local_f8);
  TwoPartyServer::TwoPartyServer
            ((TwoPartyServer *)(local_d0 + 0x20),(Client *)(local_d0 + 0x10),&local_f8);
  kj::Maybe<kj::Function<kj::String_(const_kj::Exception_&)>_>::~Maybe(&local_f8);
  Capability::Client::~Client((Client *)(local_d0 + 0x10));
  kj::Own<capnp::_::TestInterfaceImpl,_std::nullptr_t>::~Own
            ((Own<capnp::_::TestInterfaceImpl,_std::nullptr_t> *)local_d0);
  pAVar4 = kj::Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar4->_vptr_AsyncIoProvider[3])();
  kj::StringPtr::StringPtr((StringPtr *)&stack0xfffffffffffffed8,"127.0.0.1");
  (*(code *)**(undefined8 **)CONCAT44(extraout_var,iVar2))
            (&local_118,(undefined8 *)CONCAT44(extraout_var,iVar2),local_128.ptr.ptr,local_120,0);
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)&stack0xfffffffffffffec0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x185,0x12);
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)local_110,&local_118);
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(&local_118);
  pNVar5 = kj::Own<kj::NetworkAddress,_std::nullptr_t>::operator->
                     ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_110);
  (*pNVar5->_vptr_NetworkAddress[2])(&listenPromise);
  pCVar6 = kj::Own<kj::ConnectionReceiver,_std::nullptr_t>::operator*
                     ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&listenPromise);
  TwoPartyServer::listen((TwoPartyServer *)local_160,(int)local_d0 + 0x20,(int)pCVar6);
  pAVar4 = kj::Own<kj::AsyncIoProvider,_std::nullptr_t>::operator->
                     ((Own<kj::AsyncIoProvider,_std::nullptr_t> *)&ioContext.lowLevelProvider.ptr);
  iVar2 = (*pAVar4->_vptr_AsyncIoProvider[3])();
  kj::StringPtr::StringPtr(&local_188,"127.0.0.1");
  pCVar7 = kj::Own<kj::ConnectionReceiver,_std::nullptr_t>::operator->
                     ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&listenPromise);
  iVar3 = (*pCVar7->_vptr_ConnectionReceiver[2])();
  (*(code *)**(undefined8 **)CONCAT44(extraout_var_00,iVar2))
            (&local_178,(undefined8 *)CONCAT44(extraout_var_00,iVar2),local_188.content.ptr,
             local_188.content.size_,iVar3);
  kj::SourceLocation::SourceLocation
            (&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x18b,0xd);
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_> *)&local_170,&local_178);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::operator=
            ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_110,&local_170);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::~Own(&local_170);
  kj::Promise<kj::Own<kj::NetworkAddress,_std::nullptr_t>_>::~Promise(&local_178);
  pNVar5 = kj::Own<kj::NetworkAddress,_std::nullptr_t>::operator->
                     ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_110);
  (**pNVar5->_vptr_NetworkAddress)(&local_1c0);
  pcVar8 = (char *)0x15;
  kj::SourceLocation::SourceLocation
            ((SourceLocation *)local_1d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x18e);
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::wait
            ((Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)local_1b8,&local_1c0);
  kj::Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>::~Promise(&local_1c0);
  connection_00 =
       kj::Own<kj::AsyncIoStream,_std::nullptr_t>::operator*
                 ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_1b8);
  TwoPartyClient::TwoPartyClient((TwoPartyClient *)&cap.field_0x10,connection_00);
  TwoPartyClient::bootstrap((TwoPartyClient *)&request.hook.ptr);
  Capability::Client::castAs<capnproto_test::capnp::test::TestInterface>
            ((Client *)local_570,(Client *)&request.hook.ptr);
  Capability::Client::~Client((Client *)&request.hook.ptr);
  kj::Maybe<capnp::MessageSize>::Maybe(&local_5d0);
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_5b8,(Client *)local_570,&local_5d0);
  kj::Maybe<capnp::MessageSize>::~Maybe(&local_5d0);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setI((Builder *)local_5b8,0x7b);
  capnproto_test::capnp::test::TestInterface::FooParams::Builder::setJ((Builder *)local_5b8,true);
  local_608 = 0;
  DStack_604 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_608);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_600,&stack0xfffffffffffff9fc,
             (int *)&server.tasks.location.columnNumber);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_600);
  iVar2 = (int)pcVar8;
  __buf = extraout_RDX;
  if (!bVar1) {
    response.hook.ptr._7_1_ = kj::_::Debug::shouldLog(ERROR);
    __buf = extraout_RDX_00;
    while (iVar2 = (int)pcVar8, (bool)response.hook.ptr._7_1_ != false) {
      response.hook.ptr._0_4_ = 0;
      local_1d8._16_8_ = "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount";
      pcVar8 = "failed: expected (0) == (callCount)";
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x195,ERROR,
                 "\"failed: expected \" \"(0) == (callCount)\", _kjCondition, 0, callCount",
                 (char (*) [36])"failed: expected (0) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_600,(int *)&response.hook.ptr,
                 (int *)&server.tasks.location.columnNumber);
      __buf = extraout_RDX_01;
      response.hook.ptr._7_1_ = false;
    }
  }
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
          *)local_680,(int)local_5b8,__buf,local_1d8._16_8_,iVar2);
  kj::SourceLocation::SourceLocation
            (&local_698,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
             ,&DAT_009b6b8e,0x196,0x13);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> *)
             local_650,local_680);
  RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestInterface::FooResults> *)local_680);
  local_6d8 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  _auStack_6e8 = (ArrayPtr<const_char>)
                 capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                           ((Reader *)local_650);
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_6d0,
             (DebugExpression<char_const(&)[4]> *)&local_6d8,(Reader *)auStack_6e8);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_6d0);
  if (!bVar1) {
    local_6e9 = kj::_::Debug::shouldLog(ERROR);
    while (local_6e9 != false) {
      RVar9 = capnproto_test::capnp::test::TestInterface::FooResults::Reader::getX
                        ((Reader *)local_650);
      _kjCondition_2._32_8_ = RVar9.super_StringPtr.content.ptr;
      kj::_::Debug::
      log<char_const(&)[46],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x197,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (response.getX())\", _kjCondition, \"foo\", response.getX()"
                 ,(char (*) [46])"failed: expected (\"foo\") == (response.getX())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_6d0,
                 (char (*) [4])"foo",(Reader *)&_kjCondition_2.result);
      local_6e9 = false;
    }
  }
  local_730 = 1;
  DStack_72c = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_730);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_728,&stack0xfffffffffffff8d4,
             (int *)&server.tasks.location.columnNumber);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_728);
  if (!bVar1) {
    local_731 = kj::_::Debug::shouldLog(ERROR);
    while (local_731 != false) {
      local_738 = 1;
      kj::_::Debug::log<char_const(&)[36],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++"
                 ,0x198,ERROR,
                 "\"failed: expected \" \"(1) == (callCount)\", _kjCondition, 1, callCount",
                 (char (*) [36])"failed: expected (1) == (callCount)",
                 (DebugComparison<int,_int_&> *)local_728,&local_738,
                 (int *)&server.tasks.location.columnNumber);
      local_731 = false;
    }
  }
  Response<capnproto_test::capnp::test::TestInterface::FooResults>::~Response
            ((Response<capnproto_test::capnp::test::TestInterface::FooResults> *)local_650);
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::~Request((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)local_5b8);
  capnproto_test::capnp::test::TestInterface::Client::~Client((Client *)local_570);
  TwoPartyClient::~TwoPartyClient((TwoPartyClient *)&cap.field_0x10);
  kj::Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)local_1b8);
  kj::Promise<void>::~Promise((Promise<void> *)local_160);
  kj::Own<kj::ConnectionReceiver,_std::nullptr_t>::~Own
            ((Own<kj::ConnectionReceiver,_std::nullptr_t> *)&listenPromise);
  kj::Own<kj::NetworkAddress,_std::nullptr_t>::~Own
            ((Own<kj::NetworkAddress,_std::nullptr_t> *)local_110);
  TwoPartyServer::~TwoPartyServer((TwoPartyServer *)(local_d0 + 0x20));
  kj::AsyncIoContext::~AsyncIoContext((AsyncIoContext *)local_40);
  return;
}

Assistant:

TEST(TwoPartyNetwork, ConvenienceClasses) {
  auto ioContext = kj::setupAsyncIo();

  int callCount = 0;
  TwoPartyServer server(kj::heap<TestInterfaceImpl>(callCount));

  auto address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1").wait(ioContext.waitScope);

  auto listener = address->listen();
  auto listenPromise = server.listen(*listener);

  address = ioContext.provider->getNetwork()
      .parseAddress("127.0.0.1", listener->getPort()).wait(ioContext.waitScope);

  auto connection = address->connect().wait(ioContext.waitScope);
  TwoPartyClient client(*connection);
  auto cap = client.bootstrap().castAs<test::TestInterface>();

  auto request = cap.fooRequest();
  request.setI(123);
  request.setJ(true);
  EXPECT_EQ(0, callCount);
  auto response = request.send().wait(ioContext.waitScope);
  EXPECT_EQ("foo", response.getX());
  EXPECT_EQ(1, callCount);
}